

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O0

void __thiscall argparse::Argument::Argument<2ul,0ul,1ul>(void *param_1,undefined8 param_2)

{
  string_view aName;
  string_view aName_00;
  undefined1 uVar1;
  basic_string_view<char,_std::char_traits<char>_> *__args;
  iterator iVar2;
  iterator iVar3;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 uVar4;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 local_1a [2];
  undefined8 local_18;
  void *local_10;
  
  local_18 = param_2;
  local_10 = param_1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x195ff1);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)param_1 + 0x18));
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  std::any::any((any *)0x196025);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  std::any::any((any *)0x19604b);
  std::
  variant<std::function<std::any(std::__cxx11::string_const&)>,std::function<void(std::__cxx11::string_const&)>>
  ::
  variant<std::function<std::any(std::__cxx11::string_const&)>,argparse::Argument::mAction::_lambda(std::__cxx11::string_const&)_1_,void>
            ((variant<std::function<std::any_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>,_std::function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>_>
              *)((long)param_1 + 0x88),local_1a);
  std::vector<std::any,_std::allocator<std::any>_>::vector
            ((vector<std::any,_std::allocator<std::any>_> *)0x196081);
  *(undefined4 *)((long)param_1 + 200) = 1;
  __args = (basic_string_view<char,_std::char_traits<char>_> *)((long)param_1 + 0xcc);
  aName._M_str._0_7_ = in_stack_ffffffffffffff50;
  aName._M_len = (size_t)__args;
  aName._M_str._7_1_ = in_stack_ffffffffffffff57;
  uVar1 = is_optional(aName);
  uVar4 = true;
  if (!(bool)uVar1) {
    aName_00._M_str._0_7_ = in_stack_ffffffffffffff50;
    aName_00._M_len = (size_t)__args;
    aName_00._M_str._7_1_ = (bool)uVar1;
    in_stack_ffffffffffffff3e = is_optional(aName_00);
    uVar4 = in_stack_ffffffffffffff3e;
  }
  *(byte *)&__args->_M_len = (byte)__args->_M_len & 0xfe | uVar4;
  *(byte *)((long)param_1 + 0xcc) = *(byte *)((long)param_1 + 0xcc) & 0xfd;
  *(byte *)((long)param_1 + 0xcc) = *(byte *)((long)param_1 + 0xcc) & 0xfb;
  *(byte *)((long)param_1 + 0xcc) = *(byte *)((long)param_1 + 0xcc) & 0xf7;
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(uVar1,in_stack_ffffffffffffff50),__args);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(uVar1,in_stack_ffffffffffffff50),__args);
  iVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)));
  iVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT17(uVar4,CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)));
  std::
  sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,argparse::Argument::Argument<2ul,0ul,1ul>(std::basic_string_view<char,std::char_traits<char>>(&&)[2ul],std::integer_sequence<unsigned_long,0ul,1ul>)::_lambda(auto:1_const&,auto:2_const&)_1_>
            (iVar2._M_current,iVar3._M_current);
  return;
}

Assistant:

explicit Argument(std::string_view(&&a)[N], std::index_sequence<I...>)
                : mIsOptional((is_optional(a[I]) || ...)), mIsRequired(false),
                  mIsRepeatable(false), mIsUsed(false) {
            ((void)mNames.emplace_back(a[I]), ...);
            std::sort(
                    mNames.begin(), mNames.end(), [](const auto &lhs, const auto &rhs) {
                        return lhs.size() == rhs.size() ? lhs < rhs : lhs.size() < rhs.size();
                    });
        }